

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

size_t __thiscall llama_context::state_seq_get_size(llama_context *this,llama_seq_id seq_id)

{
  llama_io_write_i *in_RDI;
  exception *err;
  llama_io_write_dummy io;
  llama_context *this_00;
  size_t local_8;
  
  this_00 = (llama_context *)&stack0xffffffffffffffd8;
  llama_io_write_dummy::llama_io_write_dummy((llama_io_write_dummy *)this_00);
  local_8 = state_seq_write_data(this_00,in_RDI,0);
  llama_io_write_dummy::~llama_io_write_dummy((llama_io_write_dummy *)0x3dfe9b);
  return local_8;
}

Assistant:

size_t llama_context::state_seq_get_size(llama_seq_id seq_id) {
    llama_io_write_dummy io;
    try {
        return state_seq_write_data(io, seq_id);
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: error getting state size: %s\n", __func__, err.what());
        return 0;
    }
}